

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O0

bool __thiscall ModuleWriter::_removeUnusedFromModule(ModuleWriter *this)

{
  StringRef name;
  bool bVar1;
  ulong uVar2;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  *in_RDI;
  undefined1 auVar3 [16];
  pair<std::_Rb_tree_const_iterator<llvm::Function_*>,_bool> pVar4;
  pair<std::_Rb_tree_const_iterator<llvm::GlobalVariable_*>,_bool> pVar5;
  pair<std::_Rb_tree_const_iterator<llvm::GlobalAlias_*>,_bool> pVar6;
  GlobalAlias *ga_1;
  iterator __end1_4;
  iterator __begin1_4;
  set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
  *__range1_4;
  GlobalVariable *gv_1;
  iterator __end1_3;
  iterator __begin1_3;
  set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  *__range1_3;
  Function *f;
  iterator __end1_2;
  iterator __begin1_2;
  set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_> *__range1_2;
  GlobalAlias *ga;
  iterator __end1_1;
  iterator __begin1_1;
  AliasListType *__range1_1;
  GlobalVariable *gv;
  global_iterator E;
  global_iterator I_1;
  Function *func;
  Function *I;
  iterator __end1;
  iterator __begin1;
  Module *__range1;
  set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
  aliases;
  set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  globals;
  set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_> funs;
  char *keep [1];
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  byte bVar7;
  _Self local_1a0;
  _Self in_stack_fffffffffffffe68;
  set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
  *in_stack_fffffffffffffe70;
  char *(*in_stack_fffffffffffffe78) [1];
  _Self in_stack_fffffffffffffe80;
  _Self in_stack_fffffffffffffe88;
  _Self local_160;
  _Self local_158;
  undefined1 *local_150;
  _Base_ptr local_148;
  undefined1 local_140;
  reference local_138;
  reference local_130;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalAlias,_false,_false,_void>,_false,_false>
  local_128;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalAlias,_false,_false,_void>,_false,_false>
  local_120;
  AliasListType *local_118;
  _Base_ptr local_110;
  undefined1 local_108;
  reference local_100;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  local_f8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0;
  undefined1 local_d8 [16];
  reference local_c8;
  reference local_c0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_b8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_b0;
  node_pointer local_a8;
  undefined1 local_40 [48];
  undefined8 local_10;
  
  local_10 = std::__cxx11::string::c_str();
  std::set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>::set
            ((set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
              *)0x19a580);
  std::
  set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  ::set((set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
         *)0x19a58d);
  std::
  set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>::
  set((set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
       *)0x19a59a);
  local_a8 = in_RDI[1].NodePtr;
  local_b0.NodePtr =
       (node_pointer)
       llvm::Module::begin((Module *)
                           CONCAT17(in_stack_fffffffffffffe4f,
                                    CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  local_b8.NodePtr =
       (node_pointer)
       llvm::Module::end((Module *)
                         CONCAT17(in_stack_fffffffffffffe4f,
                                  CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  while( true ) {
    bVar1 = llvm::operator!=(&local_b0,&local_b8);
    if (!bVar1) break;
    local_c8 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                            *)0x19a600);
    local_c0 = local_c8;
    auVar3 = llvm::Value::getName();
    name.Length = (size_t)in_stack_fffffffffffffe88._M_node;
    name.Data = (char *)in_stack_fffffffffffffe80._M_node;
    local_d8 = auVar3;
    bVar1 = array_match<char_const*[1]>(name,in_stack_fffffffffffffe78);
    if (!bVar1) {
      uVar2 = llvm::Value::hasNUses((uint)local_c8);
      if ((uVar2 & 1) != 0) {
        pVar4 = std::
                set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
                ::insert(in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68._M_node);
        local_e8 = (_Base_ptr)pVar4.first._M_node;
        local_e0 = pVar4.second;
      }
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
    ::operator++(in_RDI);
  }
  local_f0.NodePtr =
       (node_pointer)
       llvm::Module::global_begin
                 ((Module *)
                  CONCAT17(in_stack_fffffffffffffe4f,
                           CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  local_f8.NodePtr =
       (node_pointer)
       llvm::Module::global_end
                 ((Module *)
                  CONCAT17(in_stack_fffffffffffffe4f,
                           CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  while( true ) {
    bVar1 = llvm::operator!=(&local_f0,&local_f8);
    if (!bVar1) break;
    local_100 = llvm::
                ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                             *)0x19a6fe);
    uVar2 = llvm::Value::hasNUses((uint)local_100);
    if ((uVar2 & 1) != 0) {
      pVar5 = std::
              set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
              ::insert((set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
                        *)in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68._M_node)
      ;
      local_110 = (_Base_ptr)pVar5.first._M_node;
      local_108 = pVar5.second;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                  *)in_RDI);
  }
  local_118 = llvm::Module::getAliasList((Module *)in_RDI[1].NodePtr);
  local_120.NodePtr =
       (node_pointer)
       llvm::simple_ilist<llvm::GlobalAlias>::begin
                 ((simple_ilist<llvm::GlobalAlias> *)
                  CONCAT17(in_stack_fffffffffffffe4f,
                           CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  local_128.NodePtr =
       (node_pointer)
       llvm::simple_ilist<llvm::GlobalAlias>::end
                 ((simple_ilist<llvm::GlobalAlias> *)
                  CONCAT17(in_stack_fffffffffffffe4f,
                           CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  while( true ) {
    bVar1 = llvm::operator!=(&local_120,&local_128);
    if (!bVar1) break;
    local_130 = llvm::
                ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalAlias,_false,_false,_void>,_false,_false>
                ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalAlias,_false,_false,_void>,_false,_false>
                             *)0x19a7b8);
    uVar2 = llvm::Value::hasNUses((uint)local_130);
    if ((uVar2 & 1) != 0) {
      local_138 = local_130;
      pVar6 = std::
              set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
              ::insert((set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
                        *)in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68._M_node)
      ;
      local_148 = (_Base_ptr)pVar6.first._M_node;
      local_140 = pVar6.second;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalAlias,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalAlias,_false,_false,_void>,_false,_false>
                  *)in_RDI);
  }
  local_150 = local_40;
  local_158._M_node =
       (_Base_ptr)
       std::set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>::
       begin((set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
              *)CONCAT17(in_stack_fffffffffffffe4f,
                         CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  local_160._M_node =
       (_Base_ptr)
       std::set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>::
       end((set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_> *)
           CONCAT17(in_stack_fffffffffffffe4f,
                    CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  while( true ) {
    bVar1 = std::operator!=(&local_158,&local_160);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<llvm::Function_*>::operator*
              ((_Rb_tree_const_iterator<llvm::Function_*> *)0x19a861);
    llvm::Function::eraseFromParent();
    std::_Rb_tree_const_iterator<llvm::Function_*>::operator++
              ((_Rb_tree_const_iterator<llvm::Function_*> *)in_RDI);
  }
  std::
  set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  ::begin((set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
           *)CONCAT17(in_stack_fffffffffffffe4f,
                      CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  std::
  set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  ::end((set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
         *)CONCAT17(in_stack_fffffffffffffe4f,
                    CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffe88,(_Self *)&stack0xfffffffffffffe80);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<llvm::GlobalVariable_*>::operator*
              ((_Rb_tree_const_iterator<llvm::GlobalVariable_*> *)0x19a8c9);
    llvm::GlobalVariable::eraseFromParent();
    std::_Rb_tree_const_iterator<llvm::GlobalVariable_*>::operator++
              ((_Rb_tree_const_iterator<llvm::GlobalVariable_*> *)in_RDI);
  }
  std::
  set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>::
  begin((set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
         *)CONCAT17(in_stack_fffffffffffffe4f,
                    CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  local_1a0._M_node =
       (_Base_ptr)
       std::
       set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
       ::end((set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
              *)CONCAT17(in_stack_fffffffffffffe4f,
                         CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffe68,&local_1a0);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<llvm::GlobalAlias_*>::operator*
              ((_Rb_tree_const_iterator<llvm::GlobalAlias_*> *)0x19a931);
    llvm::GlobalAlias::eraseFromParent();
    std::_Rb_tree_const_iterator<llvm::GlobalAlias_*>::operator++
              ((_Rb_tree_const_iterator<llvm::GlobalAlias_*> *)in_RDI);
  }
  bVar1 = std::set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
          ::empty((set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
                   *)0x19a95c);
  bVar7 = 1;
  if (bVar1) {
    bVar1 = std::
            set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
            ::empty((set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
                     *)0x19a978);
    bVar7 = 1;
    if (bVar1) {
      bVar1 = std::
              set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
              ::empty((set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
                       *)0x19a994);
      bVar7 = bVar1 ^ 0xff;
    }
  }
  std::
  set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>::
  ~set((set<llvm::GlobalAlias_*,_std::less<llvm::GlobalAlias_*>,_std::allocator<llvm::GlobalAlias_*>_>
        *)0x19a9af);
  std::
  set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
  ::~set((set<llvm::GlobalVariable_*,_std::less<llvm::GlobalVariable_*>,_std::allocator<llvm::GlobalVariable_*>_>
          *)0x19a9bc);
  std::set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>::~set
            ((set<llvm::Function_*,_std::less<llvm::Function_*>,_std::allocator<llvm::Function_*>_>
              *)0x19a9c9);
  return (bool)(bVar7 & 1);
}

Assistant:

bool _removeUnusedFromModule() {
        using namespace llvm;
        // do not slice away these functions no matter what
        // FIXME do it a vector and fill it dynamically according
        // to what is the setup (like for sv-comp or general..)
        const char *keep[] = {options.dgOptions.entryFunction.c_str()};

        // when erasing while iterating the slicer crashes
        // so set the to be erased values into container
        // and then erase them
        std::set<Function *> funs;
        std::set<GlobalVariable *> globals;
        std::set<GlobalAlias *> aliases;

        for (auto &I : *M) {
            Function *func = &I;
            if (array_match(func->getName(), keep))
                continue;

            // if the function is unused or we haven't constructed it
            // at all in dependence graph, we can remove it
            // (it may have some uses though - like when one
            // unused func calls the other unused func
            if (func->hasNUses(0))
                funs.insert(func);
        }

        for (auto I = M->global_begin(), E = M->global_end(); I != E; ++I) {
            GlobalVariable *gv = &*I;
            if (gv->hasNUses(0))
                globals.insert(gv);
        }

        for (GlobalAlias &ga : M->getAliasList()) {
            if (ga.hasNUses(0))
                aliases.insert(&ga);
        }

        for (Function *f : funs)
            f->eraseFromParent();
        for (GlobalVariable *gv : globals)
            gv->eraseFromParent();
        for (GlobalAlias *ga : aliases)
            ga->eraseFromParent();

        return (!funs.empty() || !globals.empty() || !aliases.empty());
    }